

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O0

TiXmlString operator+(TiXmlString *a,TiXmlString *b)

{
  size_type sVar1;
  size_type sVar2;
  TiXmlString *in_RDX;
  TiXmlString *b_local;
  TiXmlString *a_local;
  TiXmlString *tmp;
  
  TiXmlString::TiXmlString(a);
  sVar1 = TiXmlString::length(b);
  sVar2 = TiXmlString::length(in_RDX);
  TiXmlString::reserve(a,sVar1 + sVar2);
  TiXmlString::operator+=(a,b);
  TiXmlString::operator+=(a,in_RDX);
  return (TiXmlString)(Rep *)a;
}

Assistant:

TiXmlString operator + (const TiXmlString & a, const TiXmlString & b)
{
	TiXmlString tmp;
	tmp.reserve(a.length() + b.length());
	tmp += a;
	tmp += b;
	return tmp;
}